

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIoa.c
# Opt level: O1

Aig_Obj_t * Saig_ManReadNode(Aig_Man_t *p,int *pNum2Id,char *pToken)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  
  cVar1 = *pToken;
  if (cVar1 == 'l') {
    if (pToken[1] == 'i') {
      return (Aig_Obj_t *)0x0;
    }
    if (pToken[1] != 'o') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIoa.c"
                    ,0xe4,"Aig_Obj_t *Saig_ManReadNode(Aig_Man_t *, int *, char *)");
    }
    iVar2 = atoi(pToken + 2);
    uVar3 = iVar2 + p->nTruePis;
joined_r0x006db150:
    if ((int)uVar3 < 0) goto LAB_006db171;
    pVVar4 = p->vCis;
  }
  else {
    if (cVar1 == 'p') {
      if (pToken[1] == 'o') {
        return (Aig_Obj_t *)0x0;
      }
      if (pToken[1] != 'i') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIoa.c"
                      ,0xd7,"Aig_Obj_t *Saig_ManReadNode(Aig_Man_t *, int *, char *)");
      }
      uVar3 = atoi(pToken + 2);
      goto joined_r0x006db150;
    }
    if (cVar1 != 'n') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIoa.c"
                    ,0xe7,"Aig_Obj_t *Saig_ManReadNode(Aig_Man_t *, int *, char *)");
    }
    iVar2 = atoi(pToken + 1);
    pVVar4 = p->vObjs;
    if (pVVar4 == (Vec_Ptr_t *)0x0) {
      return (Aig_Obj_t *)0x0;
    }
    uVar3 = pNum2Id[iVar2];
    if ((int)uVar3 < 0) goto LAB_006db171;
  }
  if ((int)uVar3 < pVVar4->nSize) {
    return (Aig_Obj_t *)pVVar4->pArray[uVar3];
  }
LAB_006db171:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Aig_Obj_t * Saig_ManReadNode( Aig_Man_t * p, int * pNum2Id, char * pToken )
{
    int Num;
    if ( pToken[0] == 'n' )
    {
        Num = atoi( pToken + 1 );
        return Aig_ManObj( p, pNum2Id[Num] );
    }
    if ( pToken[0] == 'p' )
    {
        pToken++;
        if ( pToken[0] == 'i' )
        {
            Num = atoi( pToken + 1 );
            return Aig_ManCi( p, Num );
        }
        if ( pToken[0] == 'o' )
            return NULL;
        assert( 0 );
        return NULL;
    }
    if ( pToken[0] == 'l' )
    {
        pToken++;
        if ( pToken[0] == 'o' )
        {
            Num = atoi( pToken + 1 );
            return Saig_ManLo( p, Num );
        }
        if ( pToken[0] == 'i' )
            return NULL;
        assert( 0 );
        return NULL;
    }
    assert( 0 );
    return NULL;
}